

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 simd_test_sse4_1::c_imm_v64_shr_n_s8<5>(c_v64 a)

{
  c_v64 cVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_2_ = a.u16[0] >> 5;
  auVar2._2_2_ = a.u16[1] >> 5;
  auVar2._4_2_ = a.u16[2] >> 5;
  auVar2._6_2_ = a.u16[3] >> 5;
  auVar2._8_8_ = 0;
  auVar2 = auVar2 & _DAT_00c1e1a0 ^ _DAT_00c1e200;
  cVar1._0_1_ = auVar2[0] - DAT_00c1e200;
  cVar1._1_1_ = auVar2[1] - DAT_00c1e200._1_1_;
  cVar1._2_1_ = auVar2[2] - DAT_00c1e200._2_1_;
  cVar1._3_1_ = auVar2[3] - DAT_00c1e200._3_1_;
  cVar1._4_1_ = auVar2[4] - DAT_00c1e200._4_1_;
  cVar1._5_1_ = auVar2[5] - DAT_00c1e200._5_1_;
  cVar1._6_1_ = auVar2[6] - DAT_00c1e200._6_1_;
  cVar1._7_1_ = auVar2[7] - DAT_00c1e200._7_1_;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}